

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuerySegment.hpp
# Opt level: O0

void __thiscall
cppjieba::QuerySegment::Cut
          (QuerySegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res,bool hmm)

{
  const_iterator pRVar1;
  bool bVar2;
  pointer pWVar3;
  size_t sVar4;
  ulong uVar5;
  DictUnit *pDVar6;
  DictTrie *in_RCX;
  WordRange wr_1;
  size_t i_1;
  WordRange wr;
  size_t i;
  const_iterator mixResItr;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> fullRes;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> mixRes;
  const_iterator in_stack_fffffffffffffec8;
  DictTrie *in_stack_fffffffffffffed0;
  DictUnit *in_stack_fffffffffffffed8;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *in_stack_fffffffffffffee0;
  WordRange local_b0;
  long local_a0;
  WordRange local_98;
  long local_88;
  WordRange *local_80;
  WordRange *local_78;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> local_70;
  undefined1 in_stack_ffffffffffffffb7;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *in_stack_ffffffffffffffb8;
  const_iterator in_stack_ffffffffffffffc0;
  const_iterator in_stack_ffffffffffffffc8;
  MixSegment *in_stack_ffffffffffffffd0;
  
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::vector
            ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)0x1ce302);
  MixSegment::Cut(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                  in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::vector
            ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)0x1ce341);
  local_78 = (WordRange *)
             std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::begin
                       ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                        in_stack_fffffffffffffec8);
  __gnu_cxx::
  __normal_iterator<cppjieba::WordRange_const*,std::vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>>>
  ::__normal_iterator<cppjieba::WordRange*>
            ((__normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
              *)in_stack_fffffffffffffed0,
             (__normal_iterator<cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
              *)in_stack_fffffffffffffec8);
  while( true ) {
    local_80 = (WordRange *)
               std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::end
                         ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                          in_stack_fffffffffffffec8);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                        *)in_stack_fffffffffffffed0,
                       (__normal_iterator<cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                        *)in_stack_fffffffffffffec8);
    if (!bVar2) break;
    pWVar3 = __gnu_cxx::
             __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
             ::operator->((__normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                           *)&local_70);
    sVar4 = WordRange::Length(pWVar3);
    if (2 < sVar4) {
      local_88 = 0;
      while( true ) {
        uVar5 = local_88 + 1;
        pWVar3 = __gnu_cxx::
                 __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                 ::operator->((__normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                               *)&local_70);
        sVar4 = WordRange::Length(pWVar3);
        if (sVar4 <= uVar5) break;
        pWVar3 = __gnu_cxx::
                 __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                 ::operator->((__normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                               *)&local_70);
        pRVar1 = pWVar3->left + local_88;
        pWVar3 = __gnu_cxx::
                 __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                 ::operator->((__normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                               *)&local_70);
        WordRange::WordRange(&local_98,pRVar1,pWVar3->left + local_88 + 1);
        pDVar6 = DictTrie::Find(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                                (const_iterator)0x1ce495);
        if (pDVar6 != (DictUnit *)0x0) {
          std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                    (in_stack_fffffffffffffee0,(value_type *)in_stack_fffffffffffffed8);
        }
        local_88 = local_88 + 1;
      }
    }
    pWVar3 = __gnu_cxx::
             __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
             ::operator->((__normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                           *)&local_70);
    sVar4 = WordRange::Length(pWVar3);
    if (3 < sVar4) {
      local_a0 = 0;
      while( true ) {
        uVar5 = local_a0 + 2;
        pWVar3 = __gnu_cxx::
                 __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                 ::operator->((__normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                               *)&local_70);
        sVar4 = WordRange::Length(pWVar3);
        if (sVar4 <= uVar5) break;
        in_stack_fffffffffffffee0 = &local_70;
        pWVar3 = __gnu_cxx::
                 __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                 ::operator->((__normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                               *)in_stack_fffffffffffffee0);
        pRVar1 = pWVar3->left + local_a0;
        pWVar3 = __gnu_cxx::
                 __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                 ::operator->((__normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                               *)in_stack_fffffffffffffee0);
        WordRange::WordRange(&local_b0,pRVar1,pWVar3->left + local_a0 + 2);
        in_stack_fffffffffffffed8 =
             DictTrie::Find(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                            (const_iterator)0x1ce614);
        if (in_stack_fffffffffffffed8 != (DictUnit *)0x0) {
          std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                    (in_stack_fffffffffffffee0,(value_type *)in_stack_fffffffffffffed8);
        }
        local_a0 = local_a0 + 1;
      }
    }
    in_stack_fffffffffffffed0 = in_RCX;
    __gnu_cxx::
    __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
    ::operator*((__normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                 *)&local_70);
    std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
              (in_stack_fffffffffffffee0,(value_type *)in_stack_fffffffffffffed8);
    __gnu_cxx::
    __normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
    ::operator++((__normal_iterator<const_cppjieba::WordRange_*,_std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>_>
                  *)in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  }
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::~vector
            (in_stack_fffffffffffffee0);
  std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::~vector
            (in_stack_fffffffffffffee0);
  return;
}

Assistant:

void Cut(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end, vector<WordRange>& res, bool hmm) const {
    //use mix Cut first
    vector<WordRange> mixRes;
    mixSeg_.Cut(begin, end, mixRes, hmm);

    vector<WordRange> fullRes;
    for (vector<WordRange>::const_iterator mixResItr = mixRes.begin(); mixResItr != mixRes.end(); mixResItr++) {
      if (mixResItr->Length() > 2) {
        for (size_t i = 0; i + 1 < mixResItr->Length(); i++) {
          WordRange wr(mixResItr->left + i, mixResItr->left + i + 1);
          if (trie_->Find(wr.left, wr.right + 1) != NULL) {
            res.push_back(wr);
          }
        }
      }
      if (mixResItr->Length() > 3) {
        for (size_t i = 0; i + 2 < mixResItr->Length(); i++) {
          WordRange wr(mixResItr->left + i, mixResItr->left + i + 2);
          if (trie_->Find(wr.left, wr.right + 1) != NULL) {
            res.push_back(wr);
          }
        }
      }
      res.push_back(*mixResItr);
    }
  }